

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::flipEdgeManual
          (SignpostIntrinsicTriangulation *this,Edge e,double newLength,double forwardAngle,
          double reverseAngle,bool isOrig,bool reverseFlip)

{
  Edge e_00;
  Edge e_01;
  Halfedge e_02;
  Halfedge e_03;
  Halfedge e_04;
  Edge e_05;
  Edge e_06;
  Halfedge he;
  Halfedge he_00;
  Face f;
  Face f_00;
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  double *pdVar3;
  ParentMeshT *pPVar4;
  ParentMeshT *pPVar5;
  Vector2 *pVVar6;
  size_t sVar7;
  bool *pbVar8;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Edge *in_XMM0_Qa;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *in_XMM1_Qa;
  SignpostIntrinsicTriangulation *in_XMM2_Qa;
  Halfedge HVar9;
  Vector2 VVar10;
  bool in_stack_00000177;
  SurfaceMesh *in_stack_00000178;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> in_stack_00000180;
  bool flipped;
  int i;
  int flipCount;
  MeshData<geometrycentral::surface::Edge,_double> *in_stack_fffffffffffffe20;
  ParentMeshT *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  SignpostIntrinsicTriangulation *in_stack_fffffffffffffe70;
  ParentMeshT *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  double local_f0;
  double local_e8;
  double local_c0;
  double local_b8;
  SignpostIntrinsicTriangulation *this_01;
  ParentMeshT *pPVar11;
  ParentMeshT *pPVar12;
  int local_3c;
  
  iVar2 = 1;
  if ((in_R8B & 1) != 0) {
    iVar2 = 3;
  }
  local_3c = 0;
  while( true ) {
    if (iVar2 <= local_3c) {
      e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
           = in_stack_fffffffffffffe30;
      e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_fffffffffffffe28;
      pdVar3 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                         (in_stack_fffffffffffffe20,e_00);
      *pdVar3 = (double)in_XMM0_Qa;
      e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
           = in_stack_fffffffffffffe30;
      e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_fffffffffffffe28;
      pdVar3 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                         (in_stack_fffffffffffffe20,e_01);
      *pdVar3 = (double)in_XMM0_Qa;
      HVar9 = Edge::halfedge(in_XMM0_Qa);
      pPVar12 = HVar9.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh;
      HVar9.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .ind = in_stack_fffffffffffffe30;
      HVar9.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .mesh = in_stack_fffffffffffffe28;
      pdVar3 = MeshData<geometrycentral::surface::Halfedge,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Halfedge,_double> *)in_XMM1_Qa,HVar9);
      *pdVar3 = (double)in_XMM1_Qa;
      pPVar4 = (ParentMeshT *)(in_RDI + 0x10f0);
      Edge::halfedge(in_XMM0_Qa);
      HVar9 = Halfedge::twin((Halfedge *)in_XMM0_Qa);
      this_01 = (SignpostIntrinsicTriangulation *)
                HVar9.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh;
      pPVar11 = (ParentMeshT *)
                HVar9.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind;
      e_02.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_XMM2_Qa;
      e_02.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh = pPVar4;
      pdVar3 = MeshData<geometrycentral::surface::Halfedge,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Halfedge,_double> *)in_XMM1_Qa,e_02);
      *pdVar3 = (double)in_XMM2_Qa;
      Edge::halfedge(in_XMM0_Qa);
      he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = in_stack_fffffffffffffe80;
      he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffe78;
      VVar10 = halfedgeVector(in_stack_fffffffffffffe70,he);
      pPVar5 = (ParentMeshT *)(in_RDI + 0x630);
      Edge::halfedge(in_XMM0_Qa);
      e_03.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_XMM2_Qa;
      e_03.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh = pPVar4;
      pVVar6 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                         (in_XMM1_Qa,e_03);
      local_c0 = VVar10.x;
      pVVar6->x = local_c0;
      local_b8 = VVar10.y;
      pVVar6->y = local_b8;
      Edge::halfedge(in_XMM0_Qa);
      Halfedge::twin((Halfedge *)in_XMM0_Qa);
      he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .ind = in_stack_fffffffffffffe80;
      he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .mesh = in_stack_fffffffffffffe78;
      VVar10 = halfedgeVector(in_stack_fffffffffffffe70,he_00);
      sVar7 = in_RDI + 0x630;
      Edge::halfedge(in_XMM0_Qa);
      Halfedge::twin((Halfedge *)in_XMM0_Qa);
      e_04.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_XMM2_Qa;
      e_04.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh = pPVar4;
      pVVar6 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                         (in_XMM1_Qa,e_04);
      local_f0 = VVar10.x;
      pVVar6->x = local_f0;
      local_e8 = VVar10.y;
      pVVar6->y = local_e8;
      Edge::halfedge(in_XMM0_Qa);
      Halfedge::face((Halfedge *)in_XMM0_Qa);
      f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)pPVar12;
      f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           pPVar11;
      updateFaceBasis(this_01,f);
      Edge::halfedge(in_XMM0_Qa);
      Halfedge::twin((Halfedge *)in_XMM0_Qa);
      Halfedge::face((Halfedge *)in_XMM0_Qa);
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
           = (size_t)pPVar12;
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
           = pPVar11;
      updateFaceBasis(this_01,f_00);
      e_05.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
           = (size_t)in_XMM2_Qa;
      e_05.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
           = pPVar4;
      pbVar8 = MeshData<geometrycentral::surface::Edge,_bool>::operator[]
                         ((MeshData<geometrycentral::surface::Edge,_bool> *)in_XMM1_Qa,e_05);
      *pbVar8 = (bool)(in_CL & 1);
      e_06.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
           = sVar7;
      e_06.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
           = pPVar5;
      invokeEdgeFlipCallbacks(in_XMM2_Qa,e_06);
      return;
    }
    ::std::
    unique_ptr<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
    ::operator->((unique_ptr<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                  *)0x2c6cdb);
    bVar1 = SurfaceMesh::flip(in_stack_00000178,(Edge)in_stack_00000180,in_stack_00000177);
    if (!bVar1) break;
    local_3c = local_3c + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"could not perform manual flip");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SignpostIntrinsicTriangulation::flipEdgeManual(Edge e, double newLength, double forwardAngle, double reverseAngle,
                                                    bool isOrig, bool reverseFlip) {

  int flipCount = reverseFlip ? 3 : 1; // three flips give opposite orientaiton
  for (int i = 0; i < flipCount; i++) {
    bool flipped = intrinsicMesh->flip(e, false);
    if (!flipped) throw std::runtime_error("could not perform manual flip");
  }

  intrinsicEdgeLengths[e] = newLength;
  edgeLengths[e] = newLength;

  // Update other derived geometric data
  intrinsicHalfedgeDirections[e.halfedge()] = forwardAngle;
  intrinsicHalfedgeDirections[e.halfedge().twin()] = reverseAngle;
  halfedgeVectorsInVertex[e.halfedge()] = halfedgeVector(e.halfedge());
  halfedgeVectorsInVertex[e.halfedge().twin()] = halfedgeVector(e.halfedge().twin());
  updateFaceBasis(e.halfedge().face());
  updateFaceBasis(e.halfedge().twin().face());

  edgeIsOriginal[e] = isOrig;
  invokeEdgeFlipCallbacks(e);
}